

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_extra.c
# Opt level: O0

int nsync_time_sleep_until(nsync_time abs_deadline)

{
  int iVar1;
  nsync_time nVar2;
  undefined8 local_90;
  nsync_time remaining;
  nsync_time now;
  int result;
  nsync_time abs_deadline_local;
  
  now.tv_nsec._4_4_ = 0;
  nVar2 = nsync::nsync_time_now();
  iVar1 = nsync::nsync_time_cmp(abs_deadline,nVar2);
  if (0 < iVar1) {
    nVar2 = nsync::nsync_time_sub(abs_deadline,nVar2);
    local_90 = (nsync *)nVar2.tv_sec;
    nVar2.tv_sec = nVar2.tv_nsec;
    nVar2 = nsync::nsync_time_sleep(local_90,nVar2);
    iVar1 = nsync::nsync_time_cmp(nVar2,(nsync_time)ZEXT816(0));
    if (0 < iVar1) {
      now.tv_nsec._4_4_ = 4;
    }
  }
  return now.tv_nsec._4_4_;
}

Assistant:

int nsync_time_sleep_until (nsync_time abs_deadline) {
	int result = 0;
	nsync_time now;
	now = nsync_time_now ();
	if (nsync_time_cmp (abs_deadline, now) > 0) {
		nsync_time remaining;
		remaining = nsync_time_sleep (nsync_time_sub (abs_deadline, now));
		if (nsync_time_cmp (remaining, nsync_time_zero) > 0) {
			result = EINTR;
		}
	}
	return (result);
}